

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void * uo_cb_stack_pop(uo_cb *cb)

{
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  void **ppvVar4;
  ulong uVar5;
  
  sVar2 = (cb->stack).count;
  if (sVar2 != 0) {
    uVar1 = sVar2 - 1;
    (cb->stack).count = uVar1;
    ppvVar4 = (cb->stack).items;
    uVar5 = (cb->stack).capacity;
    pvVar3 = ppvVar4[sVar2 - 1];
    if (3 < uVar1 && uVar1 == uVar5 >> 3) {
      uVar5 = uVar5 >> 1;
      (cb->stack).capacity = uVar5;
      ppvVar4 = (void **)realloc(ppvVar4,uVar5 << 3);
      (cb->stack).items = ppvVar4;
    }
    return pvVar3;
  }
  __assert_fail("stack->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_stack/src/include/uo_stack/uo_stack.h"
                ,0x97,"void *uo_stack_pop(uo_stack *)");
}

Assistant:

inline void *uo_cb_stack_pop(
    uo_cb *cb)
{
    return uo_stack_pop(&cb->stack);
}